

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

bool __thiscall
kj::anon_unknown_9::DiskHandle::ReplacerImpl<kj::Directory>::tryCommit
          (ReplacerImpl<kj::Directory> *this)

{
  DiskHandle *this_00;
  bool bVar1;
  int fromDirFd;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48 [2];
  Fault local_28;
  Fault f;
  DebugExpression<bool> _kjCondition;
  ReplacerImpl<kj::Directory> *this_local;
  
  f.exception._6_1_ = (this->committed ^ 0xffU) & 1;
  f.exception._7_1_ =
       _::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7));
  if (bVar1) {
    this_00 = this->handle;
    StringPtr::StringPtr((StringPtr *)local_48,&this->path);
    fromDirFd = OwnFd::operator_cast_to_int(&this->handle->fd);
    StringPtr::StringPtr((StringPtr *)&local_58,&this->tempPath);
    this_local._7_1_ =
         tryCommitReplacement
                   (this_00,(StringPtr)local_48[0],fromDirFd,(StringPtr)local_58,
                    (this->super_Replacer<kj::Directory>).mode,(int *)0x0);
    this->committed = this_local._7_1_;
  }
  else {
    _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[18]>
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x503,FAILED,"!committed","_kjCondition,\"already committed\"",
               (DebugExpression<bool> *)((long)&f.exception + 7),(char (*) [18])"already committed")
    ;
    this_local._7_1_ = false;
    _::Debug::Fault::~Fault(&local_28);
  }
  return this_local._7_1_;
}

Assistant:

bool tryCommit() override {
      KJ_ASSERT(!committed, "already committed") { return false; }
      return committed = handle.tryCommitReplacement(path, handle.fd, tempPath,
                                                     Directory::Replacer<T>::mode);
    }